

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O2

void __thiscall FTypeTable::AddType(FTypeTable *this,PType *type)

{
  PClass *pPVar1;
  size_t sVar2;
  PType *pPVar3;
  intptr_t parm2;
  intptr_t parm1;
  intptr_t local_40;
  intptr_t local_38;
  
  pPVar1 = DObject::GetClass((DObject *)type);
  pPVar1 = *(PClass **)
            &pPVar1[1].super_PNativeStruct.super_PStruct.super_PNamedType.super_PCompoundType.
             super_PType.super_PTypeBase.super_DObject;
  (*(type->super_PTypeBase).super_DObject._vptr_DObject[0x14])(type,&local_38,&local_40);
  sVar2 = Hash(pPVar1,local_38,local_40);
  pPVar3 = FindType(this,pPVar1,local_38,local_40,(size_t *)0x0);
  if (pPVar3 == (PType *)0x0) {
    type->HashNext = this->TypeHash[sVar2 % 0x3fd];
    this->TypeHash[sVar2 % 0x3fd] = type;
    GC::WriteBarrier((DObject *)type);
    return;
  }
  __assert_fail("FindType(metatype, parm1, parm2, NULL) == NULL && \"Type must not be inserted more than once\""
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobjtype.cpp"
                ,0xe3e,"void FTypeTable::AddType(PType *)");
}

Assistant:

void FTypeTable::AddType(PType *type)
{
	PClass *metatype;
	intptr_t parm1, parm2;
	size_t bucket;

	metatype = type->GetClass()->TypeTableType;
	type->GetTypeIDs(parm1, parm2);
	bucket = Hash(metatype, parm1, parm2) % HASH_SIZE;
	assert(FindType(metatype, parm1, parm2, NULL) == NULL && "Type must not be inserted more than once");

	type->HashNext = TypeHash[bucket];
	TypeHash[bucket] = type;
	GC::WriteBarrier(type);
}